

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseElement
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  char *p_00;
  DescriptorPool *pDVar1;
  MessageFactory *factory;
  uint number;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  uint32_t uVar5;
  FieldDescriptor *pFVar6;
  Descriptor *pDVar7;
  MessageLite *this_00;
  UnknownFieldSet *this_01;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  string_view value;
  char *ptr_local;
  uint32_t tag;
  InternalMetadata *local_e0;
  uint64_t local_d8;
  char *p;
  uint64_t tmp;
  string payload;
  ParseContext tmp_ctx;
  
  payload._M_dataplus._M_p = (pointer)&payload.field_2;
  payload._M_string_length = 0;
  local_e0 = &(this->msg->super_MessageLite)._internal_metadata_;
  payload.field_2._M_local_buf[0] = '\0';
  uVar10 = 0;
  iVar9 = 0;
  ptr_local = ptr;
LAB_00cdf2ea:
  local_d8 = uVar10 * 8 + 2;
  do {
    bVar4 = ParseContext::Done(ctx,&ptr_local);
    pcVar8 = ptr_local;
    if (bVar4) goto LAB_00cdf55f;
    p_00 = ptr_local + 1;
    tag = (uint32_t)(byte)*ptr_local;
    if (tag == 0x1a) {
      if (iVar9 == 1) {
        iVar9 = (int)uVar10;
        ptr_local = p_00;
        bVar4 = Descriptor::IsExtensionNumber(this->descriptor,iVar9);
        if (bVar4) {
          pDVar1 = (ctx->data_).pool;
          if (pDVar1 == (DescriptorPool *)0x0) {
            pFVar6 = Reflection::FindKnownExtensionByNumber(this->reflection,iVar9);
          }
          else {
            pFVar6 = DescriptorPool::FindExtensionByNumber(pDVar1,this->descriptor,iVar9);
          }
        }
        else {
          pFVar6 = (FieldDescriptor *)0x0;
        }
        ptr_local = _InternalParseAndMergeField
                              (this->msg,ptr_local,ctx,local_d8,this->reflection,pFVar6);
        iVar9 = 3;
      }
      else if (iVar9 == 0) {
        ptr_local = p_00;
        uVar5 = ReadSize(&ptr_local);
        if (ptr_local == (char *)0x0) goto LAB_00cdf54f;
        ptr_local = EpsCopyInputStream::ReadString
                              (&ctx->super_EpsCopyInputStream,ptr_local,uVar5,&payload);
        iVar9 = 2;
      }
      else {
        ptr_local = p_00;
        uVar5 = ReadSize(&ptr_local);
        if (ptr_local == (char *)0x0) goto LAB_00cdf54f;
        ptr_local = EpsCopyInputStream::Skip(&ctx->super_EpsCopyInputStream,ptr_local,uVar5);
      }
    }
    else {
      if (*ptr_local == 0x10) break;
      ptr_local = p_00;
      ptr_local = ReadTag(pcVar8,&tag,0);
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        pcVar8 = ptr_local;
        goto LAB_00cdf55f;
      }
      ptr_local = UnknownFieldParse(tag,(string *)0x0,ptr_local,ctx);
    }
    if (ptr_local == (char *)0x0) goto LAB_00cdf54f;
  } while( true );
  ptr_local = p_00;
  ptr_local = ParseBigVarint(p_00,&tmp);
  number = (uint)tmp;
  if ((ptr_local == (char *)0x0) || ((uint)tmp == 0)) goto LAB_00cdf54f;
  if (iVar9 == 0) {
    uVar10 = (ulong)(uint)tmp;
    iVar9 = 1;
  }
  else if (iVar9 == 2) {
    pDVar1 = (ctx->data_).pool;
    if (pDVar1 == (DescriptorPool *)0x0) {
      pFVar6 = Reflection::FindKnownExtensionByNumber(this->reflection,(uint)tmp);
    }
    else {
      pFVar6 = DescriptorPool::FindExtensionByNumber(pDVar1,this->descriptor,(uint)tmp);
    }
    if ((pFVar6 == (FieldDescriptor *)0x0) ||
       (pDVar7 = FieldDescriptor::message_type(pFVar6), pDVar7 == (Descriptor *)0x0)) {
      sVar3 = payload._M_string_length;
      _Var2._M_p = payload._M_dataplus._M_p;
      this_01 = InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                          (local_e0);
      value._M_str = _Var2._M_p;
      value._M_len = sVar3;
      UnknownFieldSet::AddLengthDelimited(this_01,number,value);
      uVar10 = (ulong)number;
      iVar9 = 3;
    }
    else {
      bVar4 = FieldDescriptor::is_repeated(pFVar6);
      factory = (ctx->data_).factory;
      if (bVar4) {
        this_00 = &Reflection::AddMessage(this->reflection,this->msg,pFVar6,factory)->
                   super_MessageLite;
      }
      else {
        this_00 = &Reflection::MutableMessage(this->reflection,this->msg,pFVar6,factory)->
                   super_MessageLite;
      }
      ParseContext::ParseContext<std::__cxx11::string&>(&tmp_ctx,ctx,&p,&payload);
      pcVar8 = MessageLite::_InternalParse(this_00,p,&tmp_ctx);
      if (pcVar8 == (char *)0x0) goto LAB_00cdf54f;
      uVar10 = (ulong)number;
      iVar9 = 3;
      if (tmp_ctx.super_EpsCopyInputStream.last_tag_minus_1_ != 0) {
LAB_00cdf54f:
        pcVar8 = (char *)0x0;
LAB_00cdf55f:
        std::__cxx11::string::~string((string *)&payload);
        return pcVar8;
      }
    }
  }
  goto LAB_00cdf2ea;
}

Assistant:

const char* ParseElement(const char* ptr, internal::ParseContext* ctx) {
    // Parse a MessageSetItem
    auto metadata = reflection->MutableInternalMetadata(msg);
    enum class State { kNoTag, kHasType, kHasPayload, kDone };
    State state = State::kNoTag;

    std::string payload;
    uint32_t type_id = 0;
    while (!ctx->Done(&ptr)) {
      // We use 64 bit tags in order to allow typeid's that span the whole
      // range of 32 bit numbers.
      uint32_t tag = static_cast<uint8_t>(*ptr++);
      if (tag == WireFormatLite::kMessageSetTypeIdTag) {
        uint64_t tmp;
        ptr = ParseBigVarint(ptr, &tmp);
        // We should fail parsing if type id is 0 after cast to uint32.
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                       static_cast<uint32_t>(tmp) != 0);
        if (state == State::kNoTag) {
          type_id = static_cast<uint32_t>(tmp);
          state = State::kHasType;
        } else if (state == State::kHasPayload) {
          type_id = static_cast<uint32_t>(tmp);
          const FieldDescriptor* field;
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(type_id);
          } else {
            field =
                ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
          }
          if (field == nullptr || field->message_type() == nullptr) {
            WriteLengthDelimited(
                type_id, payload,
                metadata->mutable_unknown_fields<UnknownFieldSet>());
          } else {
            Message* value =
                field->is_repeated()
                    ? reflection->AddMessage(msg, field, ctx->data().factory)
                    : reflection->MutableMessage(msg, field,
                                                 ctx->data().factory);
            const char* p;
            // We can't use regular parse from string as we have to track
            // proper recursion depth and descriptor pools. Spawn a new
            // ParseContext inheriting those attributes.
            ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
            GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                           tmp_ctx.EndedAtLimit());
          }
          state = State::kDone;
        }
        continue;
      } else if (tag == WireFormatLite::kMessageSetMessageTag) {
        if (state == State::kNoTag) {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->ReadString(ptr, size, &payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          state = State::kHasPayload;
        } else if (state == State::kHasType) {
          // We're now parsing the payload
          const FieldDescriptor* field = nullptr;
          if (descriptor->IsExtensionNumber(type_id)) {
            if (ctx->data().pool == nullptr) {
              field = reflection->FindKnownExtensionByNumber(type_id);
            } else {
              field =
                  ctx->data().pool->FindExtensionByNumber(descriptor, type_id);
            }
          }
          ptr = WireFormat::_InternalParseAndMergeField(
              msg, ptr, ctx, static_cast<uint64_t>(type_id) * 8 + 2, reflection,
              field);
          state = State::kDone;
        } else {
          int32_t size = ReadSize(&ptr);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
          ptr = ctx->Skip(ptr, size);
          GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        }
      } else {
        // An unknown field in MessageSetItem.
        ptr = ReadTag(ptr - 1, &tag);
        if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        // Skip field.
        ptr = internal::UnknownFieldParse(
            tag, static_cast<std::string*>(nullptr), ptr, ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }